

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmOutputConverter *this,string *remote,OutputFormat format
          )

{
  bool bVar1;
  cmState *this_00;
  long lVar2;
  undefined1 local_48 [8];
  string tmp;
  OutputFormat format_local;
  string *remote_local;
  cmOutputConverter *this_local;
  
  tmp.field_2._12_4_ = format;
  this_00 = GetState(this);
  bVar1 = cmState::UseWindowsShell(this_00);
  if (((bVar1) && (lVar2 = std::__cxx11::string::find((char)remote,0x20), lVar2 != -1)) &&
     (bVar1 = cmsys::SystemTools::FileExists(remote), bVar1)) {
    std::__cxx11::string::string((string *)local_48);
    bVar1 = cmsys::SystemTools::GetShortPath(remote,(string *)local_48);
    if (bVar1) {
      ConvertToOutputFormat(__return_storage_ptr__,this,(string *)local_48,tmp.field_2._12_4_);
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  ConvertToOutputFormat(__return_storage_ptr__,this,remote,tmp.field_2._12_4_);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputForExisting(
  const std::string& remote, OutputFormat format) const
{
  // If this is a windows shell, the result has a space, and the path
  // already exists, we can use a short-path to reference it without a
  // space.
  if (this->GetState()->UseWindowsShell() &&
      remote.find(' ') != std::string::npos &&
      cmSystemTools::FileExists(remote)) {
    std::string tmp;
    if (cmSystemTools::GetShortPath(remote, tmp)) {
      return this->ConvertToOutputFormat(tmp, format);
    }
  }

  // Otherwise, perform standard conversion.
  return this->ConvertToOutputFormat(remote, format);
}